

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

Own<capnp::ClientHook,_std::nullptr_t> __thiscall
capnp::QueuedPipeline::getPipelinedCap(QueuedPipeline *this,Array<capnp::PipelineOp> *ops)

{
  ArrayDisposer **ppAVar1;
  PromiseArena *pPVar2;
  Entry *pEVar3;
  uint *puVar4;
  undefined8 uVar5;
  Refcounted *refcounted;
  void *pvVar6;
  QueuedClient *this_00;
  long *in_RDX;
  ClientHook *extraout_RDX;
  undefined8 *puVar7;
  ClientHook *extraout_RDX_00;
  ClientHook *pCVar8;
  Event *this_01;
  size_t newSize;
  EventLoop *pEVar9;
  _func_int **pp_Var10;
  Entry *pEVar11;
  ArrayPtr<kj::HashMap<kj::Array<capnp::PipelineOp>,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Entry>
  table;
  Own<capnp::ClientHook,_std::nullptr_t> OVar12;
  bool success;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_capability_c__:501:17),_kj::Own<capnp::PipelineHook>_>
  clientPromise;
  size_t pos;
  undefined1 local_c1;
  undefined1 local_c0 [80];
  ForkBranchBase *local_70;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:615:7)>
  local_68;
  undefined8 local_40;
  undefined8 uStack_38;
  
  if (ops[2].ptr == (PipelineOp *)0x0) {
    ppAVar1 = &ops[2].disposer;
    local_40 = *in_RDX;
    uStack_38 = in_RDX[1];
    local_70 = (ForkBranchBase *)
               (((long)ops[3].ptr - (long)ops[2].disposer >> 3) * -0x3333333333333333);
    table.size_ = (size_t)ops[2].disposer;
    table.ptr = (Entry *)(ops + 4);
    kj::
    HashIndex<kj::HashMap<kj::Array<capnp::PipelineOp>,kj::Own<capnp::ClientHook,decltype(nullptr)>>::Callbacks>
    ::
    insert<kj::HashMap<kj::Array<capnp::PipelineOp>,kj::Own<capnp::ClientHook,decltype(nullptr)>>::Entry,kj::ArrayPtr<capnp::PipelineOp>&>
              ((HashIndex<kj::HashMap<kj::Array<capnp::PipelineOp>,kj::Own<capnp::ClientHook,decltype(nullptr)>>::Callbacks>
                *)&local_68,table,(size_t)local_70,(ArrayPtr<capnp::PipelineOp> *)local_70);
    if ((HashIndex<kj::HashMap<kj::Array<capnp::PipelineOp>,kj::Own<capnp::ClientHook,decltype(nullptr)>>::Callbacks>
         )local_68.maybeFunc.ptr.isSet ==
        (HashIndex<kj::HashMap<kj::Array<capnp::PipelineOp>,kj::Own<capnp::ClientHook,decltype(nullptr)>>::Callbacks>
         )0x1) {
      pEVar11 = (Entry *)(*ppAVar1 + (long)local_68.maybeFunc.ptr.field_1.value.success * 0x28);
    }
    else {
      local_68.maybeFunc.ptr.field_1.value.success = (bool *)&local_c1;
      local_c1 = 0;
      local_68.maybeFunc.ptr.isSet = true;
      local_68.maybeFunc.ptr.field_1.value.pos = (size_t *)&local_70;
      local_68.maybeFunc.ptr.field_1.value.table =
           (Table<kj::HashMap<kj::Array<capnp::PipelineOp>,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Entry,_kj::HashIndex<kj::HashMap<kj::Array<capnp::PipelineOp>,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Callbacks>_>
            *)ppAVar1;
      local_68.maybeFunc.ptr.field_1.value.params =
           (ArrayPtr<capnp::PipelineOp> *)&stack0xffffffffffffffc0;
      kj::_::ForkHub<kj::Own<capnp::PipelineHook,_std::nullptr_t>_>::addBranch
                ((ForkHub<kj::Own<capnp::PipelineHook,_std::nullptr_t>_> *)local_c0);
      local_c0._24_8_ =
           kj::_::HeapArrayDisposer::allocateImpl
                     (8,0,in_RDX[1],(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      uVar5 = local_c0._0_8_;
      pEVar9 = (EventLoop *)local_c0._24_8_;
      if (in_RDX[1] != 0) {
        puVar7 = (undefined8 *)*in_RDX;
        do {
          (pEVar9->port).ptr = (EventPort *)*puVar7;
          pEVar9 = (EventLoop *)&pEVar9->running;
          puVar7 = puVar7 + 1;
        } while (puVar7 != (undefined8 *)(in_RDX[1] * 8 + *in_RDX));
      }
      pp_Var10 = (_func_int **)((long)pEVar9 - local_c0._24_8_ >> 3);
      pPVar2 = ((PromiseArenaMember *)local_c0._0_8_)->arena;
      local_c0._32_8_ = ppAVar1;
      if (pPVar2 == (PromiseArena *)0x0 || (ulong)(local_c0._0_8_ - (long)pPVar2) < 0x38) {
        pvVar6 = operator_new(0x400);
        this_01 = (Event *)local_c0._32_8_;
        local_c0._16_8_ = (long)pvVar6 + 0x3c8;
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  ((TransformPromiseNodeBase *)local_c0._16_8_,(OwnPromiseNode *)local_c0,
                   kj::_::
                   SimpleTransformPromiseNode<kj::Own<capnp::PipelineHook,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++:501:17)>
                   ::anon_class_24_1_ba1d6a12_for_func::operator());
        *(undefined ***)((long)pvVar6 + 0x3c8) = &PTR_destroy_0037b3c0;
        *(undefined8 *)((long)pvVar6 + 1000) = local_c0._24_8_;
        *(_func_int ***)((long)pvVar6 + 0x3f0) = pp_Var10;
        *(undefined8 **)((long)pvVar6 + 0x3f8) = &kj::_::HeapArrayDisposer::instance;
        *(void **)((long)pvVar6 + 0x3d0) = pvVar6;
      }
      else {
        ((PromiseArenaMember *)local_c0._0_8_)->arena = (PromiseArena *)0x0;
        local_c0._16_8_ = &((PromiseArenaMember *)(local_c0._0_8_ + -0x40))->arena;
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  ((TransformPromiseNodeBase *)local_c0._16_8_,(OwnPromiseNode *)local_c0,
                   kj::_::
                   SimpleTransformPromiseNode<kj::Own<capnp::PipelineHook,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++:501:17)>
                   ::anon_class_24_1_ba1d6a12_for_func::operator());
        ((PromiseArenaMember *)(uVar5 + -0x40))->arena = (PromiseArena *)&PTR_destroy_0037b3c0;
        ((PromiseArenaMember *)(uVar5 + -0x20))->arena = (PromiseArena *)local_c0._24_8_;
        ((PromiseArenaMember *)(uVar5 + -0x10))->_vptr_PromiseArenaMember = pp_Var10;
        ((PromiseArenaMember *)(uVar5 + -0x10))->arena =
             (PromiseArena *)&kj::_::HeapArrayDisposer::instance;
        ((PromiseArenaMember *)(uVar5 + -0x30))->_vptr_PromiseArenaMember = (_func_int **)pPVar2;
        this_01 = (Event *)local_c0._32_8_;
      }
      uVar5 = local_c0._0_8_;
      local_c0._8_8_ = local_c0._16_8_;
      if ((PromiseArenaMember *)local_c0._0_8_ != (PromiseArenaMember *)0x0) {
        local_c0._0_8_ = (PromiseArenaMember *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar5);
      }
      local_c0._40_8_ = *in_RDX;
      local_c0._48_8_ = in_RDX[1];
      local_c0._56_8_ = in_RDX[2];
      *in_RDX = 0;
      in_RDX[1] = 0;
      this_00 = (QueuedClient *)operator_new(0x68);
      QueuedClient::QueuedClient
                (this_00,(Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)(local_c0 + 8));
      uVar5 = local_c0._8_8_;
      local_c0._64_8_ = &this_00->super_Refcounted;
      puVar4 = &(this_00->super_Refcounted).refcount;
      *puVar4 = *puVar4 + 1;
      local_c0._72_8_ = this_00;
      if ((TransformPromiseNodeBase *)local_c0._8_8_ != (TransformPromiseNodeBase *)0x0) {
        local_c0._8_8_ = (TransformPromiseNodeBase *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar5);
      }
      pEVar11 = (Entry *)ops[3].ptr;
      if (pEVar11 == (Entry *)ops[3].size_) {
        pEVar3 = ((ArrayBuilder<kj::HashMap<kj::Array<capnp::PipelineOp>,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Entry>
                   *)&this_01->_vptr_Event)->ptr;
        newSize = 4;
        if (pEVar11 != pEVar3) {
          newSize = ((long)pEVar11 - (long)pEVar3 >> 3) * -0x6666666666666666;
        }
        kj::
        Vector<kj::HashMap<kj::Array<capnp::PipelineOp>,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Entry>
        ::setCapacity((Vector<kj::HashMap<kj::Array<capnp::PipelineOp>,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Entry>
                       *)this_01,newSize);
        pEVar11 = (Entry *)ops[3].ptr;
      }
      (pEVar11->key).ptr = (PipelineOp *)local_c0._40_8_;
      (pEVar11->key).size_ = local_c0._48_8_;
      local_c0._40_8_ = (Event **)0x0;
      local_c0[0x30] = false;
      local_c0._49_3_ = 0;
      local_c0._52_4_ = 0;
      (pEVar11->key).disposer = (ArrayDisposer *)local_c0._56_8_;
      (pEVar11->value).disposer = (Disposer *)local_c0._64_8_;
      (pEVar11->value).ptr = (ClientHook *)local_c0._72_8_;
      ops[3].ptr = (PipelineOp *)(pEVar11 + 1);
      local_c1 = 1;
      kj::_::
      Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.h:615:7)>
      ::~Deferred(&local_68);
    }
    (*((pEVar11->value).ptr)->_vptr_ClientHook[4])(this);
    pCVar8 = extraout_RDX_00;
  }
  else {
    (**(code **)((long)*ops[2].ptr + 0x10))(this);
    pCVar8 = extraout_RDX;
  }
  OVar12.ptr = pCVar8;
  OVar12.disposer = (Disposer *)this;
  return OVar12;
}

Assistant:

kj::Own<ClientHook> QueuedPipeline::getPipelinedCap(kj::Array<PipelineOp>&& ops) {
  KJ_IF_SOME(r, redirect) {
    return r->getPipelinedCap(kj::mv(ops));
  } else {
    return clientMap.findOrCreate(ops.asPtr(), [&]() {
      auto clientPromise = promise.addBranch()
          .then([ops = KJ_MAP(op, ops) { return op; }](kj::Own<PipelineHook> pipeline) {
        return pipeline->getPipelinedCap(kj::mv(ops));
      });
      return kj::HashMap<kj::Array<PipelineOp>, kj::Own<ClientHook>>::Entry {
        kj::mv(ops), kj::refcounted<QueuedClient>(kj::mv(clientPromise))
      };
    })->addRef();
  }
}